

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O2

uint andyzip::brotli_decoder::read_window_size(brotli_decoder_state *s)

{
  uint uVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  uint uVar3;
  
  sVar2 = brotli_decoder_state::read(s,1,in_RDX,in_RCX);
  uVar3 = 0;
  if (s->error == ok) {
    if ((int)sVar2 == 0) {
      uVar3 = 0x10;
    }
    else {
      sVar2 = brotli_decoder_state::read(s,3,__buf,in_RCX);
      if (s->error == ok) {
        if ((int)sVar2 == 0) {
          sVar2 = brotli_decoder_state::read(s,4,__buf_00,in_RCX);
          uVar1 = 0x11;
          if ((int)sVar2 != 0) {
            uVar1 = (int)sVar2 + 8;
          }
          uVar3 = 0;
          if (s->error == ok) {
            uVar3 = uVar1;
          }
        }
        else {
          uVar3 = (int)sVar2 + 0x11;
        }
      }
    }
  }
  return uVar3;
}

Assistant:

static unsigned read_window_size(brotli_decoder_state &s) {
      auto w0 = s.read(1);
      if (s.error != error_code::ok) return 0; 
      if (w0 == 0) {
        return 16;
      }

      auto w13 = s.read(3);
      if (s.error != error_code::ok) return 0; 
      if (w13 != 0) {
        return w13 + 17;
      }

      auto w47 = s.read(4);
      if (s.error != error_code::ok) return 0; 

      return w47 ? w47 + 10 - 2 : 17;
    }